

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O3

int pair1_pipe_start(void *arg)

{
  nni_mtx *mtx;
  pair1_sock *s;
  uint16_t uVar1;
  int iVar2;
  
  s = *(pair1_sock **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x11) {
    mtx = &s->mtx;
    nni_mtx_lock(mtx);
    if (s->p == (pair1_pipe *)0x0) {
      s->p = (pair1_pipe *)arg;
      s->rd_ready = false;
      nni_mtx_unlock(mtx);
      pair1_send_sched(s);
      nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x1d8));
      iVar2 = 0;
    }
    else {
      nni_mtx_unlock(mtx);
      uVar1 = nni_pipe_peer(*arg);
      nng_log_warn("NNG-PAIR-BUSY","Peer pipe protocol %d is already paired, rejected.",(ulong)uVar1
                  );
      nni_stat_inc(&s->stat_reject_already,1);
      iVar2 = 4;
    }
  }
  else {
    nni_stat_inc(&s->stat_reject_mismatch,1);
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x11
                );
    iVar2 = 0xd;
  }
  return iVar2;
}

Assistant:

static int
pair1_pipe_start(void *arg)
{
	pair1_pipe *p = arg;
	pair1_sock *s = p->pair;

	if (nni_pipe_peer(p->pipe) != PAIR1_PEER) {
		BUMP_STAT(&s->stat_reject_mismatch);
		// Peer protocol mismatch.
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), PAIR1_PEER);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->mtx);
	if (s->p != NULL) {
		nni_mtx_unlock(&s->mtx);
		nng_log_warn("NNG-PAIR-BUSY",
		    "Peer pipe protocol %d is already paired, rejected.",
		    nni_pipe_peer(p->pipe));
		BUMP_STAT(&s->stat_reject_already);
		return (NNG_EBUSY);
	}
	s->p        = p;
	s->rd_ready = false;
	nni_mtx_unlock(&s->mtx);

	pair1_send_sched(s);

	// And the pipe read of course.
	nni_pipe_recv(p->pipe, &p->aio_recv);

	return (0);
}